

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

DoubleParameter * __thiscall
CoreML::Specification::AdamOptimizer::mutable_beta1(AdamOptimizer *this)

{
  DoubleParameter *this_00;
  AdamOptimizer *this_local;
  
  if (this->beta1_ == (DoubleParameter *)0x0) {
    this_00 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(this_00);
    this->beta1_ = this_00;
  }
  return this->beta1_;
}

Assistant:

inline ::CoreML::Specification::DoubleParameter* AdamOptimizer::mutable_beta1() {
  
  if (beta1_ == NULL) {
    beta1_ = new ::CoreML::Specification::DoubleParameter;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.AdamOptimizer.beta1)
  return beta1_;
}